

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O1

Color __thiscall PlasticBSDF::f(PlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Color CVar13;
  
  fVar4 = ABS(wo->z);
  fVar7 = 1.0 - fVar4 * fVar4;
  if (fVar7 <= 0.0) {
    fVar7 = 0.0;
  }
  fVar10 = *(float *)&(this->super_BSDF).field_0x24;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = fVar7 / fVar10;
  fVar8 = 1.0;
  if (fVar7 < 1.0) {
    fVar7 = 1.0 - fVar7 * fVar7;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar8 = (fVar10 * fVar4 - fVar7) / (fVar10 * fVar4 + fVar7);
    fVar7 = (fVar4 - fVar10 * fVar7) / (fVar10 * fVar7 + fVar4);
    fVar8 = (fVar7 * fVar7 + fVar8 * fVar8) * 0.5;
  }
  fVar7 = 1.0 - wi->z * wi->z;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar4 = 0.0;
  fVar7 = fVar7 / *(float *)&(this->super_BSDF).field_0x24;
  uVar5 = 0;
  if (fVar7 < 1.0) {
    fVar7 = 1.0 - fVar7 * fVar7;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar10 = 1.0 / *(float *)&(this->super_BSDF).field_0x24;
    fVar4 = 1.0 - fVar7 * fVar7;
    if (fVar4 <= 0.0) {
      fVar4 = 0.0;
    }
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar9 = 1.0;
    fVar4 = fVar4 / fVar10;
    if (fVar4 < 1.0) {
      fVar4 = 1.0 - fVar4 * fVar4;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      fVar9 = (fVar10 * fVar7 - fVar4) / (fVar10 * fVar7 + fVar4);
      fVar7 = (fVar7 - fVar10 * fVar4) / (fVar10 * fVar4 + fVar7);
      fVar9 = (fVar7 * fVar7 + fVar9 * fVar9) * 0.5;
    }
    auVar11._0_4_ = (1.0 - fVar8) * (1.0 - fVar9);
    fVar7 = *(float *)&(this->super_BSDF).field_0x24;
    fVar7 = 1.0 / (fVar7 * fVar7);
    fVar4 = 1.0 - this->outRatio;
    uVar1 = albedo->x;
    uVar2 = albedo->y;
    auVar11._4_4_ = auVar11._0_4_;
    auVar11._8_4_ = auVar11._0_4_;
    auVar11._12_4_ = auVar11._0_4_;
    auVar3._4_4_ = 1.0 - fVar4 * (float)uVar2;
    auVar3._0_4_ = 1.0 - fVar4 * (float)uVar1;
    auVar3._8_4_ = 0.0 - fVar4 * 0.0;
    auVar3._12_4_ = 0.0 - fVar4 * 0.0;
    auVar12 = divps(auVar11,auVar3);
    auVar6._0_4_ = fVar7 * auVar12._0_4_;
    auVar6._4_4_ = fVar7 * auVar12._4_4_;
    auVar6._8_4_ = fVar7 * auVar12._8_4_;
    auVar6._12_4_ = fVar7 * auVar12._12_4_;
    auVar12._4_4_ = PI;
    auVar12._0_4_ = PI;
    auVar12._8_4_ = PI;
    auVar12._12_4_ = PI;
    auVar12 = divps(auVar6,auVar12);
    uVar5 = CONCAT44(auVar12._4_4_ * (float)uVar2,auVar12._0_4_ * (float)uVar1);
    fVar4 = (((auVar11._0_4_ / (1.0 - fVar4 * albedo->z)) * fVar7) / PI) * albedo->z;
  }
  CVar13.z = fVar4;
  CVar13.x = (float)(int)uVar5;
  CVar13.y = (float)(int)((ulong)uVar5 >> 0x20);
  return CVar13;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const
	{
		// non-Dirac component only
		float energy = 1;
		energy *= 1 - DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		float sint = sqrtf(1-wi.z*wi.z)/IOR;
		if (sint >= 1) return 0; // total reflect (shouldn't happen if IOR>1)
		float cost = sqrtf(1-sint*sint);
		energy *= 1 - DielectricBRDF::reflectivity(cost, 1/IOR);
		float ratio2 = 1/(IOR*IOR); // see note_refract_radiance
		return energy / (1 - albedo * (1-outRatio)) * ratio2 * 1/PI * albedo;
	}